

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_checkPiTarget(ENCODING *enc,char *ptr,char *end,int *tokPtr)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  end[0] = '\v';
  end[1] = '\0';
  end[2] = '\0';
  end[3] = '\0';
  iVar4 = 1;
  iVar3 = iVar4;
  if (((long)ptr - (long)enc == 6) && (*(char *)enc->scanners == '\0')) {
    cVar1 = *(char *)((long)enc->scanners + 1);
    if (cVar1 == 'x') {
      bVar2 = false;
    }
    else {
      if (cVar1 != 'X') {
        return 1;
      }
      bVar2 = true;
    }
    if (*(char *)((long)enc->scanners + 2) == '\0') {
      cVar1 = *(char *)((long)enc->scanners + 3);
      if (cVar1 != 'm') {
        if (cVar1 != 'M') {
          return 1;
        }
        bVar2 = true;
      }
      if (*(char *)((long)enc->scanners + 4) == '\0') {
        cVar1 = *(char *)((long)enc->scanners + 5);
        if (cVar1 == 'l') {
          iVar3 = 0;
          if (!bVar2) {
            end[0] = '\f';
            end[1] = '\0';
            end[2] = '\0';
            end[3] = '\0';
            iVar3 = iVar4;
          }
        }
        else if (cVar1 == 'L') {
          return 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static
int PREFIX(checkPiTarget)(const ENCODING *enc, const char *ptr, const char *end, int *tokPtr)
{
  int upper = 0;
  cmExpatUnused(enc);
  *tokPtr = XML_TOK_PI;
  if (end - ptr != MINBPC(enc)*3)
    return 1;
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_x:
    break;
  case ASCII_X:
    upper = 1;
    break;
  default:
    return 1;
  }
  ptr += MINBPC(enc);
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_m:
    break;
  case ASCII_M:
    upper = 1;
    break;
  default:
    return 1;
  }
  ptr += MINBPC(enc);
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_l:
    break;
  case ASCII_L:
    upper = 1;
    break;
  default:
    return 1;
  }
  if (upper)
    return 0;
  *tokPtr = XML_TOK_XML_DECL;
  return 1;
}